

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O2

void Js::DynamicProfileInfo::GetSourceAndFunctionId
               (FunctionBody *functionBody,FunctionInfo *calleeFunctionInfo,
               JavascriptFunction *calleeFunction,SourceId *sourceId,LocalFunctionId *functionId)

{
  FunctionProxy *this;
  code *pcVar1;
  bool bVar2;
  SourceId SVar3;
  LocalFunctionId LVar4;
  undefined4 *puVar5;
  ScriptContext *pSVar6;
  ScriptContext *pSVar7;
  DWORD_PTR DVar8;
  DWORD_PTR DVar9;
  
  if (sourceId == (SourceId *)0x0 || functionId == (LocalFunctionId *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x281,"(sourceId != nullptr && functionId != nullptr)",
                                "sourceId != nullptr && functionId != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  *sourceId = 0xfffffffc;
  if (calleeFunction == (JavascriptFunction *)0x0) {
    LVar4 = 0xfffffffd;
  }
  else {
    this = (calleeFunctionInfo->functionBodyImpl).ptr;
    pSVar6 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
    if (this == (FunctionProxy *)0x0) {
      if (pSVar6 == (((((calleeFunction->super_DynamicObject).super_RecyclableObject.type.ptr)->
                      javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr) {
        *sourceId = 0xfffffffe;
        LVar4 = calleeFunctionInfo->functionId;
      }
      else {
        LVar4 = 0xfffffffe;
      }
    }
    else {
      pSVar7 = FunctionProxy::GetScriptContext(this);
      LVar4 = 0xfffffffe;
      if (pSVar6 == pSVar7) {
        DVar8 = FunctionProxy::GetSecondaryHostSourceContext((FunctionProxy *)functionBody);
        DVar9 = FunctionProxy::GetSecondaryHostSourceContext(this);
        if (DVar8 == DVar9) {
          DVar8 = FunctionProxy::GetHostSourceContext((FunctionProxy *)functionBody);
          DVar9 = FunctionProxy::GetHostSourceContext(this);
          if (DVar8 == DVar9) {
            SVar3 = 0xfffffffd;
          }
          else {
            DVar8 = FunctionProxy::GetHostSourceContext(this);
            SVar3 = (SourceId)DVar8;
          }
          *sourceId = SVar3;
        }
        else {
          DVar8 = FunctionProxy::GetHostSourceContext(this);
          if (DVar8 != 0xfffffffffffffffe) goto LAB_00885e6a;
          *sourceId = 0xfffffffb;
        }
        LVar4 = FunctionProxy::GetLocalFunctionId(this);
      }
    }
  }
LAB_00885e6a:
  *functionId = LVar4;
  return;
}

Assistant:

void DynamicProfileInfo::GetSourceAndFunctionId(FunctionBody * functionBody, FunctionInfo* calleeFunctionInfo, JavascriptFunction * calleeFunction, Js::SourceId * sourceId, Js::LocalFunctionId * functionId)
    {
        Assert(sourceId != nullptr && functionId != nullptr);

        *sourceId = InvalidSourceId;

        if (calleeFunction == nullptr)
        {
            *functionId = CallSiteNonFunction;
            return;
        }

        if (!calleeFunctionInfo->HasBody())
        {
            if (functionBody->GetScriptContext() == calleeFunction->GetScriptContext())
            {
                *sourceId = BuiltInSourceId;
                *functionId = calleeFunctionInfo->GetLocalFunctionId();
            }
            else
            {
                *functionId = CallSiteCrossContext;
            }
            return;
        }

        // We can only inline function that are from the same script context. So only record that data
        // We're about to call this function so deserialize it right now
        FunctionProxy * calleeFunctionProxy = calleeFunctionInfo->GetFunctionProxy();
        if (functionBody->GetScriptContext() == calleeFunctionProxy->GetScriptContext())
        {
            if (functionBody->GetSecondaryHostSourceContext() == calleeFunctionProxy->GetSecondaryHostSourceContext())
            {
                if (functionBody->GetHostSourceContext() == calleeFunctionProxy->GetHostSourceContext())
                {
                    *sourceId = CurrentSourceId; // Caller and callee in same file
                }
                else
                {
                    *sourceId = (Js::SourceId)calleeFunctionProxy->GetHostSourceContext(); // Caller and callee in different files
                }
                *functionId = calleeFunctionProxy->GetLocalFunctionId();
            }
            else if (calleeFunctionProxy->GetHostSourceContext() == Js::Constants::JsBuiltInSourceContext)
            {
                *sourceId = JsBuiltInSourceId;
                *functionId = calleeFunctionProxy->GetLocalFunctionId();
            }
            else
            {
                // Pretend that we are cross context when call is crossing script file.
                *functionId = CallSiteCrossContext;
            }
        }
        else
        {
            *functionId = CallSiteCrossContext;
        }
    }